

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

int __thiscall
Centaurus::LookaheadDFA<char>::run
          (LookaheadDFA<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq,int index,
          int input_pos)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  const_reference this_00;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *this_01;
  reference this_02;
  CharClass<char> *this_03;
  char *pcVar4;
  NFATransition<char> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range3
  ;
  LDFAState<char> *state;
  int input_pos_local;
  int index_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq_local;
  LookaheadDFA<char> *this_local;
  
  lVar3 = std::__cxx11::string::size();
  if (input_pos != lVar3) {
    this_00 = std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
              ::operator[](&(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states,(long)index)
    ;
    this_01 = LDFAState<char>::get_transitions(this_00);
    __end0 = std::
             vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ::begin(this_01);
    tr = (NFATransition<char> *)
         std::
         vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
         end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                       *)&tr), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                ::operator*(&__end0);
      this_03 = NFATransition<char>::label(this_02);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)seq);
      bVar1 = CharClass<char>::includes(this_03,*pcVar4);
      if (bVar1) {
        iVar2 = NFATransition<char>::dest(this_02);
        if (-1 < iVar2) {
          iVar2 = NFATransition<char>::dest(this_02);
          iVar2 = run(this,seq,iVar2,input_pos + 1);
          return iVar2;
        }
        iVar2 = NFATransition<char>::dest(this_02);
        return -iVar2;
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
      ::operator++(&__end0);
    }
  }
  return -1;
}

Assistant:

int run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
	{
		if (input_pos == seq.size())
		{
			return -1;
		}
		else
		{
			const LDFAState<TCHAR>& state = m_states[index];

			for (const auto& tr : state.get_transitions())
			{
				if (tr.label().includes(seq[input_pos]))
				{
					if (tr.dest() < 0)
					{
						return -tr.dest();
					}
					return run(seq, tr.dest(), input_pos + 1);
				}
			}
			return -1;
		}
	}